

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O3

const_strarray *
cfg_db_get_schema_entry_value(cfg_named_section *section,cfg_schema_entry *schema_entry)

{
  const_strarray *pcVar1;
  
  if ((section != (cfg_named_section *)0x0) &&
     (pcVar1 = cfg_db_get_entry_value
                         (section->section_type->db,section->section_type->type,section->name,
                          (schema_entry->key).entry), pcVar1 != (const_strarray *)0x0)) {
    return pcVar1;
  }
  return &schema_entry->def;
}

Assistant:

const struct const_strarray *
cfg_db_get_schema_entry_value(const struct cfg_named_section *section, const struct cfg_schema_entry *schema_entry) {
  const struct const_strarray *value;

  if (section) {
    value = cfg_db_get_entry_value(
      section->section_type->db, section->section_type->type, section->name, schema_entry->key.entry);
    if (value) {
      return value;
    }
  }

  return &schema_entry->def;
}